

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall
StringSplitter::initialize
          (StringSplitter *this,string *src,string *delim,bool duplicate,
          vector<bool,_std::allocator<bool>_> *mask)

{
  size_type sVar1;
  const_reference cVar2;
  size_type sVar3;
  ulong uVar4;
  long lVar5;
  byte local_9b;
  byte local_9a;
  bool local_99;
  value_type local_90;
  byte local_5f;
  bool local_5e;
  byte local_5d;
  uint local_5c;
  bool isMasked;
  bool isDuplicate;
  bool doParse;
  size_type sStack_58;
  uint index;
  size_type endpos;
  size_type startpos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  vector<bool,_std::allocator<bool>_> *mask_local;
  bool duplicate_local;
  string *delim_local;
  string *src_local;
  StringSplitter *this_local;
  
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)mask;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&startpos);
  endpos = 0;
  sStack_58 = 0;
  local_5c = 0;
  local_5d = 1;
  while ((local_5d & 1) != 0) {
    sStack_58 = std::__cxx11::string::find((string *)src,(string *)delim,endpos);
    local_99 = duplicate && sStack_58 == endpos;
    local_5e = local_99;
    if (!duplicate || sStack_58 != endpos) {
      sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)
                         tokens.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_9a = 0;
      if (sVar3 != 0) {
        uVar4 = (ulong)local_5c;
        sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)
                           tokens.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_9b = 1;
        if (uVar4 < sVar3) {
          cVar2 = std::vector<bool,_std::allocator<bool>_>::at
                            ((vector<bool,_std::allocator<bool>_> *)
                             tokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_5c);
          local_9b = cVar2 ^ 0xff;
        }
        local_9a = local_9b;
      }
      local_5f = local_9a & 1;
      if (local_5f == 0) {
        std::__cxx11::string::substr((ulong)&local_90,(ulong)src);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&startpos,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      local_5c = local_5c + 1;
    }
    sVar1 = sStack_58;
    if (sStack_58 == 0xffffffffffffffff) break;
    lVar5 = std::__cxx11::string::size((string *)delim);
    endpos = sVar1 + lVar5;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap(&this->_tokens,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&startpos);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&startpos);
  return;
}

Assistant:

void
    initialize(std::string const & src,
               std::string const & delim,
               bool duplicate = false,
               std::vector<bool> const & mask = std::vector<bool>())
    {
        std::vector<std::string> tokens;
        std::string::size_type startpos = 0;
        std::string::size_type endpos = 0;
        unsigned int index = 0;
        bool doParse = true;
        while (doParse)
        {

            endpos = src.find(delim, startpos);

            // Check delimiter is not duplicate
            bool isDuplicate = (duplicate && (endpos == startpos));
            if (!isDuplicate)
            {
                // Check entry is not masked out
                bool isMasked = (mask.size()!=0) && (( (index >= mask.size()) || (!mask.at(index)) ));
                if (!isMasked)
                {
                    tokens.push_back(src.substr(startpos, endpos - startpos));
                }
                index++;
            }

            // We just copied the last token
            if (endpos == std::string::npos) break;

           // Exclude the delimiter in the next search
            startpos = endpos + delim.size();

        }
        this->_tokens.swap(tokens);
    }